

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O1

void __thiscall CCharacterCore::Tick(CCharacterCore *this,bool UseInput)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CWorldCore *pCVar6;
  CCharacterCore *pCVar7;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar9;
  bool bVar10;
  bool bVar11;
  CTuneParam *pCVar12;
  vec2 vVar13;
  vec2 *pvVar14;
  CWorldCore *pCVar15;
  int i;
  long lVar16;
  int i_1;
  ulong uVar17;
  long in_FS_OFFSET;
  uint uVar18;
  uint uVar19;
  float fVar20;
  vec2 vVar22;
  vec2 vVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  vec2 vVar37;
  vec2 vVar38;
  float fVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar47;
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar49;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar50;
  vec2 NewPos;
  undefined1 local_b8 [16];
  float local_8c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_88;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_84;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_38;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_34;
  long local_30;
  undefined8 uVar21;
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_TriggeredEvents = 0;
  fVar34 = (this->m_Pos).field_0.x + 14.0;
  fVar20 = (this->m_Pos).field_1.y + 14.0 + 5.0;
  uVar18 = -(uint)(0.0 < fVar34);
  uVar19 = -(uint)(0.0 < fVar20);
  bVar10 = CCollision::IsTile(this->m_pCollision,
                              (int)((float)(~uVar18 & 0xbf000000 | uVar18 & 0x3f000000) + fVar34),
                              (int)((float)(~uVar19 & 0xbf000000 | uVar19 & 0x3f000000) + fVar20),1)
  ;
  bVar11 = true;
  if (!bVar10) {
    fVar20 = (this->m_Pos).field_0.x + -14.0;
    fVar34 = (this->m_Pos).field_1.y + 14.0 + 5.0;
    uVar18 = -(uint)(0.0 < fVar20);
    uVar19 = -(uint)(0.0 < fVar34);
    bVar11 = CCollision::IsTile(this->m_pCollision,
                                (int)((float)(~uVar18 & 0xbf000000 | uVar18 & 0x3f000000) + fVar20),
                                (int)((float)(~uVar19 & 0xbf000000 | uVar19 & 0x3f000000) + fVar34),
                                1);
  }
  uVar1 = (this->m_Input).m_TargetX;
  uVar2 = (this->m_Input).m_TargetY;
  local_b8._0_4_ = (undefined4)(int)uVar1;
  local_b8._4_4_ = (undefined4)(int)uVar2;
  fVar20 = (float)local_b8._0_4_ * (float)local_b8._0_4_ +
           (float)local_b8._4_4_ * (float)local_b8._4_4_;
  local_b8._8_8_ = 0;
  if (fVar20 < 0.0) {
    fVar20 = sqrtf(fVar20);
  }
  else {
    fVar20 = SQRT(fVar20);
  }
  pCVar6 = this->m_pWorld;
  bVar10 = bVar11 != false;
  pCVar15 = (CWorldCore *)&(pCVar6->m_Tuning).m_AirControlSpeed;
  if (bVar10) {
    pCVar15 = pCVar6;
  }
  (this->m_Vel).field_1.y =
       (float)(pCVar6->m_Tuning).m_Gravity.m_Value / 100.0 + (this->m_Vel).field_1.y;
  iVar3 = (pCVar15->m_Tuning).m_GroundControlSpeed.m_Value;
  pCVar12 = &(pCVar6->m_Tuning).m_GroundControlAccel;
  if (!bVar10) {
    pCVar12 = &(pCVar6->m_Tuning).m_AirControlAccel;
  }
  iVar4 = pCVar12->m_Value;
  pCVar12 = &(pCVar6->m_Tuning).m_GroundFriction;
  if (!bVar10) {
    pCVar12 = &(pCVar6->m_Tuning).m_AirFriction;
  }
  iVar5 = pCVar12->m_Value;
  if (UseInput) {
    this->m_Direction = (this->m_Input).m_Direction;
    fVar34 = atan2f((float)(this->m_Input).m_TargetY,(float)(this->m_Input).m_TargetX);
    this->m_Angle = (int)(fVar34 * 256.0);
    uVar18 = this->m_Jumped;
    if ((this->m_Input).m_Jump == 0) {
      uVar18 = uVar18 & 0xfffffffe;
LAB_001d465c:
      this->m_Jumped = uVar18;
    }
    else if ((uVar18 & 1) == 0) {
      if (bVar11 == false) {
        if ((uVar18 & 2) != 0) goto LAB_001d465f;
        *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 2;
        (this->m_Vel).field_1.y =
             (float)(this->m_pWorld->m_Tuning).m_AirJumpImpulse.m_Value / -100.0;
        uVar18 = uVar18 | 3;
      }
      else {
        *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 1;
        (this->m_Vel).field_1.y =
             (float)(this->m_pWorld->m_Tuning).m_GroundJumpImpulse.m_Value / -100.0;
        uVar18 = uVar18 | 1;
      }
      goto LAB_001d465c;
    }
LAB_001d465f:
    if ((this->m_Input).m_Hook == 0) {
      this->m_HookState = 0;
      this->m_HookedPlayer = -1;
      this->m_HookPos = this->m_Pos;
    }
    else if (this->m_HookState == 0) {
      auVar48._4_4_ = fVar20;
      auVar48._0_4_ = fVar20;
      auVar48._8_4_ = fVar20;
      auVar48._12_4_ = fVar20;
      auVar48 = divps(local_b8,auVar48);
      fVar35 = (this->m_Pos).field_0.x + auVar48._0_4_ * 28.0 * 1.5;
      fVar41 = (this->m_Pos).field_1.y + auVar48._4_4_ * 28.0 * 1.5;
      (this->m_HookPos).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)fVar35;
      (this->m_HookPos).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)fVar41;
      (this->m_HookDir).field_0 =
           (anon_union_4_2_94730284_for_vector2_base<float>_1)(int)auVar48._0_8_;
      (this->m_HookDir).field_1 =
           (anon_union_4_2_947302a4_for_vector2_base<float>_3)(int)((ulong)auVar48._0_8_ >> 0x20);
      this->m_HookedPlayer = -1;
      this->m_HookTick = 0;
      this->m_HookState = 4;
    }
  }
  fVar20 = (float)iVar3 / 100.0;
  fVar34 = (float)iVar4 / 100.0;
  iVar3 = this->m_Direction;
  if (iVar3 < 0) {
    fVar45 = (this->m_Vel).field_0.x;
    fVar47 = fVar45;
    if (fVar34 <= 0.0) {
      if ((fVar45 <= fVar20) && (fVar47 = fVar20, fVar45 - fVar34 <= fVar20)) {
        fVar47 = fVar45 - fVar34;
      }
    }
    else {
      auVar39._0_8_ = (ulong)(uint)fVar20 ^ 0x8000000080000000;
      auVar39._8_4_ = 0x80000000;
      auVar39._12_4_ = 0x80000000;
      if (-fVar20 <= fVar45) {
        if (-fVar20 <= fVar45 - fVar34) {
          auVar39._0_4_ = fVar45 - fVar34;
        }
        fVar47 = auVar39._0_4_;
      }
    }
    (this->m_Vel).field_0.x = fVar47;
  }
  if (0 < iVar3) {
    fVar45 = (this->m_Vel).field_0.x;
    fVar47 = fVar45;
    if (0.0 <= fVar34) {
      if ((fVar45 <= fVar20) && (fVar47 = fVar20, fVar34 + fVar45 <= fVar20)) {
        fVar47 = fVar34 + fVar45;
      }
    }
    else {
      auVar43._0_8_ = (ulong)(uint)fVar20 ^ 0x8000000080000000;
      auVar43._8_4_ = 0x80000000;
      auVar43._12_4_ = 0x80000000;
      if (-fVar20 <= fVar45) {
        if (-fVar20 <= fVar34 + fVar45) {
          auVar43._0_4_ = fVar34 + fVar45;
        }
        fVar47 = auVar43._0_4_;
      }
    }
    (this->m_Vel).field_0.x = fVar47;
  }
  if (iVar3 == 0) {
    (this->m_Vel).field_0.x = ((float)iVar5 / 100.0) * (this->m_Vel).field_0.x;
  }
  if (bVar11 != false) {
    *(byte *)&this->m_Jumped = (byte)this->m_Jumped & 0xfd;
  }
  uVar18 = this->m_HookState;
  if (uVar18 == 0) {
    this->m_HookState = 0;
    this->m_HookedPlayer = -1;
    vVar13 = this->m_Pos;
LAB_001d4798:
    this->m_HookPos = vVar13;
  }
  else if (uVar18 < 3) {
    this->m_HookState = uVar18 + 1;
  }
  else if (uVar18 == 4) {
    fVar20 = (float)(this->m_pWorld->m_Tuning).m_HookFireSpeed.m_Value / 100.0;
    local_38.x = (this->m_HookPos).field_0.x + fVar20 * (this->m_HookDir).field_0.x;
    aStack_34.y = (this->m_HookPos).field_1.y + fVar20 * (this->m_HookDir).field_1.y;
    fVar20 = (this->m_Pos).field_0.x - local_38.x;
    fVar34 = (this->m_Pos).field_1.y - aStack_34.y;
    fVar20 = fVar20 * fVar20 + fVar34 * fVar34;
    if (fVar20 < 0.0) {
      fVar20 = sqrtf(fVar20);
    }
    else {
      fVar20 = SQRT(fVar20);
    }
    if ((float)(this->m_pWorld->m_Tuning).m_HookLength.m_Value / 100.0 < fVar20) {
      this->m_HookState = 1;
      auVar42._0_4_ = local_38.x - (this->m_Pos).field_0.x;
      auVar42._4_4_ = local_38.y - (this->m_Pos).field_1.y;
      auVar42._8_8_ = 0;
      fVar20 = auVar42._0_4_ * auVar42._0_4_ + auVar42._4_4_ * auVar42._4_4_;
      if (fVar20 < 0.0) {
        auVar25._0_4_ = sqrtf(fVar20);
        auVar25._4_12_ = extraout_var;
        uVar21 = auVar25._0_8_;
      }
      else {
        uVar21 = CONCAT44(auVar42._4_4_,SQRT(fVar20));
      }
      uVar33 = (undefined4)((ulong)uVar21 >> 0x20);
      auVar27._8_4_ = uVar33;
      auVar27._0_8_ = uVar21;
      auVar27._12_4_ = uVar33;
      auVar26._0_4_ = (undefined4)uVar21;
      auVar26._8_8_ = auVar27._8_8_;
      auVar26._4_4_ = auVar26._0_4_;
      auVar48 = divps(auVar42,auVar26);
      fVar20 = (float)(this->m_pWorld->m_Tuning).m_HookLength.m_Value / 100.0;
      local_38.x = (this->m_Pos).field_0.x + fVar20 * auVar48._0_4_;
      aStack_34.y = (this->m_Pos).field_1.y + fVar20 * auVar48._4_4_;
    }
    uVar18 = CCollision::IntersectLine
                       (this->m_pCollision,this->m_HookPos,_local_38,(vec2 *)&local_38,(vec2 *)0x0);
    if ((this->m_pWorld != (CWorldCore *)0x0) &&
       ((fVar20 = (float)(this->m_pWorld->m_Tuning).m_PlayerHooking.m_Value / 100.0, fVar20 != 0.0
        || (NAN(fVar20))))) {
      lVar16 = 0;
      local_8c = 0.0;
      do {
        pCVar7 = this->m_pWorld->m_apCharacters[lVar16];
        if (pCVar7 != this && pCVar7 != (CCharacterCore *)0x0) {
          aVar49 = (this->m_HookPos).field_0;
          aVar50 = (this->m_HookPos).field_1;
          aVar8 = local_38;
          aVar9 = aStack_34;
          local_88 = (pCVar7->m_Pos).field_0;
          aStack_84 = (pCVar7->m_Pos).field_1;
          fVar20 = local_38.x - aVar49.x;
          fVar45 = aStack_34.y - aVar50.y;
          fVar34 = fVar20 * fVar20 + fVar45 * fVar45;
          if (fVar34 < 0.0) {
            fVar34 = sqrtf(fVar34);
          }
          else {
            fVar34 = SQRT(fVar34);
          }
          fVar47 = (aVar49.x - aVar8.x) * (aVar49.x - aVar8.x) +
                   (aVar50.y - aVar9.y) * (aVar50.y - aVar9.y);
          if (fVar47 < 0.0) {
            fVar47 = sqrtf(fVar47);
          }
          else {
            fVar47 = SQRT(fVar47);
          }
          fVar47 = ((fVar20 / fVar34) * (local_88.x - aVar49.x) +
                   (fVar45 / fVar34) * (aStack_84.y - aVar50.y)) / fVar47;
          fVar34 = 1.0;
          if (fVar47 <= 1.0) {
            fVar34 = fVar47;
          }
          fVar34 = (float)(~-(uint)(fVar47 < 0.0) & (uint)fVar34);
          fVar20 = (pCVar7->m_Pos).field_0.x - (fVar20 * fVar34 + aVar49.x);
          fVar34 = (pCVar7->m_Pos).field_1.y - (aVar50.y + fVar34 * fVar45);
          fVar20 = fVar20 * fVar20 + fVar34 * fVar34;
          if (fVar20 < 0.0) {
            fVar20 = sqrtf(fVar20);
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          if (fVar20 < 30.0) {
            if (this->m_HookedPlayer != -1) {
              fVar20 = (this->m_HookPos).field_0.x - (pCVar7->m_Pos).field_0.x;
              fVar34 = (this->m_HookPos).field_1.y - (pCVar7->m_Pos).field_1.y;
              fVar20 = fVar20 * fVar20 + fVar34 * fVar34;
              if (fVar20 < 0.0) {
                fVar20 = sqrtf(fVar20);
              }
              else {
                fVar20 = SQRT(fVar20);
              }
              if (local_8c <= fVar20) goto LAB_001d4d19;
            }
            *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 4;
            this->m_HookState = 5;
            this->m_HookedPlayer = (int)lVar16;
            fVar20 = (this->m_HookPos).field_0.x - (pCVar7->m_Pos).field_0.x;
            fVar34 = (this->m_HookPos).field_1.y - (pCVar7->m_Pos).field_1.y;
            local_8c = fVar20 * fVar20 + fVar34 * fVar34;
            if (local_8c < 0.0) {
              local_8c = sqrtf(local_8c);
            }
            else {
              local_8c = SQRT(local_8c);
            }
          }
        }
LAB_001d4d19:
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x40);
    }
    if (this->m_HookState == 4) {
      vVar13 = _local_38;
      if (uVar18 != 0) {
        this->m_TriggeredEvents = this->m_TriggeredEvents | (uint)((uVar18 & 4) != 0) * 8 + 8;
        this->m_HookState = uVar18 & 4 ^ 5;
      }
      goto LAB_001d4798;
    }
  }
  else if (uVar18 == 3) {
    this->m_HookState = -1;
  }
  if (this->m_HookState != 5) goto LAB_001d4ddc;
  if ((long)this->m_HookedPlayer != -1) {
    pCVar7 = this->m_pWorld->m_apCharacters[this->m_HookedPlayer];
    if (pCVar7 == (CCharacterCore *)0x0) {
      this->m_HookState = -1;
      this->m_HookedPlayer = -1;
      pvVar14 = &this->m_Pos;
    }
    else {
      pvVar14 = &pCVar7->m_Pos;
    }
    this->m_HookPos = *pvVar14;
  }
  if (this->m_HookedPlayer == -1) {
    fVar20 = (this->m_HookPos).field_0.x - (this->m_Pos).field_0.x;
    fVar34 = (this->m_HookPos).field_1.y - (this->m_Pos).field_1.y;
    fVar20 = fVar20 * fVar20 + fVar34 * fVar34;
    if (fVar20 < 0.0) {
      fVar20 = sqrtf(fVar20);
    }
    else {
      fVar20 = SQRT(fVar20);
    }
    if (46.0 < fVar20) {
      auVar44._0_4_ = (this->m_HookPos).field_0.x - (this->m_Pos).field_0.x;
      auVar44._4_4_ = (this->m_HookPos).field_1.y - (this->m_Pos).field_1.y;
      auVar44._8_8_ = 0;
      fVar20 = auVar44._0_4_ * auVar44._0_4_ + auVar44._4_4_ * auVar44._4_4_;
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      auVar24._4_4_ = fVar20;
      auVar24._0_4_ = fVar20;
      auVar24._8_4_ = fVar20;
      auVar24._12_4_ = fVar20;
      auVar48 = divps(auVar44,auVar24);
      fVar20 = (float)(this->m_pWorld->m_Tuning).m_HookDragAccel.m_Value / 100.0;
      fVar34 = fVar20 * auVar48._0_4_;
      fVar20 = fVar20 * auVar48._4_4_;
      if (0.0 < fVar20) {
        fVar20 = fVar20 * 0.3;
      }
      fVar45 = 0.95;
      if ((0.0 <= fVar34 || -1 < this->m_Direction) && (fVar34 <= 0.0 || this->m_Direction < 1)) {
        fVar45 = 0.75;
      }
      vVar13.field_0.x = fVar45 * fVar34 + (this->m_Vel).field_0.x;
      vVar13.field_1.y = fVar20 + (this->m_Vel).field_1.y;
      fVar20 = vVar13.field_0.x * vVar13.field_0.x + vVar13.field_1.y * vVar13.field_1.y;
      if (fVar20 < 0.0) {
        fVar34 = sqrtf(fVar20);
      }
      else {
        fVar34 = SQRT(fVar20);
      }
      if ((float)(this->m_pWorld->m_Tuning).m_HookDragSpeed.m_Value / 100.0 <= fVar34) {
        if (fVar20 < 0.0) {
          fVar20 = sqrtf(fVar20);
        }
        else {
          fVar20 = SQRT(fVar20);
        }
        fVar34 = (this->m_Vel).field_0.x;
        fVar45 = (this->m_Vel).field_1.y;
        fVar34 = fVar34 * fVar34 + fVar45 * fVar45;
        if (fVar34 < 0.0) {
          fVar34 = sqrtf(fVar34);
        }
        else {
          fVar34 = SQRT(fVar34);
        }
        if (fVar34 <= fVar20) goto LAB_001d4da6;
      }
      this->m_Vel = vVar13;
    }
  }
LAB_001d4da6:
  iVar3 = this->m_HookTick;
  this->m_HookTick = iVar3 + 1;
  if (((long)this->m_HookedPlayer != -1) &&
     ((0x3b < iVar3 ||
      (this->m_pWorld->m_apCharacters[this->m_HookedPlayer] == (CCharacterCore *)0x0)))) {
    this->m_HookState = -1;
    this->m_HookedPlayer = -1;
    this->m_HookPos = this->m_Pos;
  }
LAB_001d4ddc:
  if (this->m_pWorld != (CWorldCore *)0x0) {
    uVar17 = 0;
    do {
      pCVar7 = this->m_pWorld->m_apCharacters[uVar17];
      if (pCVar7 != this && pCVar7 != (CCharacterCore *)0x0) {
        fVar20 = (this->m_Pos).field_0.x - (pCVar7->m_Pos).field_0.x;
        fVar34 = (this->m_Pos).field_1.y - (pCVar7->m_Pos).field_1.y;
        fVar20 = fVar20 * fVar20 + fVar34 * fVar34;
        if (fVar20 < 0.0) {
          fVar20 = sqrtf(fVar20);
        }
        else {
          fVar20 = SQRT(fVar20);
        }
        vVar13 = this->m_Pos;
        auVar46._0_4_ = vVar13.field_0.x - (pCVar7->m_Pos).field_0.x;
        auVar46._4_4_ = vVar13.field_1.y - (pCVar7->m_Pos).field_1.y;
        auVar46._8_8_ = 0;
        fVar34 = auVar46._0_4_ * auVar46._0_4_ + auVar46._4_4_ * auVar46._4_4_;
        if (fVar34 < 0.0) {
          fVar34 = sqrtf(fVar34);
        }
        else {
          fVar34 = SQRT(fVar34);
        }
        auVar28._4_4_ = fVar34;
        auVar28._0_4_ = fVar34;
        auVar28._8_4_ = fVar34;
        auVar28._12_4_ = fVar34;
        auVar48 = divps(auVar46,auVar28);
        fVar34 = (float)(this->m_pWorld->m_Tuning).m_PlayerCollision.m_Value / 100.0;
        fVar45 = auVar48._0_4_;
        fVar47 = auVar48._4_4_;
        if (((0.0 < fVar20) && (fVar20 < 35.0)) && ((fVar34 != 0.0 || (NAN(fVar34))))) {
          fVar34 = (this->m_Vel).field_0.x;
          fVar36 = (this->m_Vel).field_1.y;
          fVar34 = fVar34 * fVar34 + fVar36 * fVar36;
          if (fVar34 < 0.0) {
            fVar34 = sqrtf(fVar34);
          }
          else {
            fVar34 = SQRT(fVar34);
          }
          fVar36 = 0.375;
          if (0.0001 < fVar34) {
            fVar34 = (this->m_Vel).field_0.x;
            fVar36 = (this->m_Vel).field_1.y;
            fVar34 = fVar34 * fVar34 + fVar36 * fVar36;
            if (fVar34 < 0.0) {
              fVar34 = sqrtf(fVar34);
            }
            else {
              fVar34 = SQRT(fVar34);
            }
            fVar36 = ((((this->m_Vel).field_0.x / fVar34) * fVar45 +
                       fVar47 * ((this->m_Vel).field_1.y / fVar34) + 1.0) * -0.5 + 1.0) * 0.75;
          }
          vVar22.field_0.x =
               ((this->m_Vel).field_0.x + fVar36 * (40.600002 - fVar20) * fVar45) * 0.85;
          vVar22.field_1.y =
               ((this->m_Vel).field_1.y + fVar36 * (40.600002 - fVar20) * fVar47) * 0.85;
          this->m_Vel = vVar22;
        }
        if (uVar17 == (uint)this->m_HookedPlayer) {
          pCVar6 = this->m_pWorld;
          fVar34 = (float)(pCVar6->m_Tuning).m_PlayerHooking.m_Value / 100.0;
          if ((42.0 < fVar20) && ((fVar34 != 0.0 || (NAN(fVar34))))) {
            auVar29._0_4_ = (float)(pCVar6->m_Tuning).m_HookDragAccel.m_Value;
            auVar29._4_4_ = (float)(pCVar6->m_Tuning).m_HookLength.m_Value;
            auVar29._8_8_ = 0;
            auVar48 = divps(auVar29,_DAT_001dbeb0);
            fVar20 = (fVar20 / auVar48._4_4_) * auVar48._0_4_;
            fVar45 = fVar45 * fVar20;
            fVar47 = fVar47 * fVar20;
            vVar37.field_0.x = (pCVar7->m_HookDragVel).field_0.x + fVar45 * 1.5;
            vVar37.field_1.y = (pCVar7->m_HookDragVel).field_1.y + fVar47 * 1.5;
            pCVar7->m_HookDragVel = vVar37;
            vVar23.field_0.x = (this->m_HookDragVel).field_0.x + fVar45 * -0.25;
            vVar23.field_1.y = (this->m_HookDragVel).field_1.y + fVar47 * -0.25;
            this->m_HookDragVel = vVar23;
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != 0x40);
  }
  fVar20 = (this->m_Vel).field_0.x;
  fVar34 = (this->m_Vel).field_1.y;
  fVar20 = fVar20 * fVar20 + fVar34 * fVar34;
  if (fVar20 < 0.0) {
    fVar20 = sqrtf(fVar20);
  }
  else {
    fVar20 = SQRT(fVar20);
  }
  if (6000.0 < fVar20) {
    fVar20 = (this->m_Vel).field_0.x;
    fVar34 = (this->m_Vel).field_1.y;
    fVar20 = fVar20 * fVar20 + fVar34 * fVar34;
    if (fVar20 < 0.0) {
      auVar30._0_4_ = sqrtf(fVar20);
      auVar30._4_12_ = extraout_var_00;
      uVar17 = auVar30._0_8_;
    }
    else {
      uVar17 = (ulong)(uint)SQRT(fVar20);
    }
    auVar40._8_8_ = 0;
    auVar40._0_4_ = (this->m_Vel).field_0;
    auVar40._4_4_ = (this->m_Vel).field_1;
    uVar33 = (undefined4)(uVar17 >> 0x20);
    auVar32._8_4_ = uVar33;
    auVar32._0_8_ = uVar17;
    auVar32._12_4_ = uVar33;
    auVar31._0_4_ = (undefined4)uVar17;
    auVar31._8_8_ = auVar32._8_8_;
    auVar31._4_4_ = auVar31._0_4_;
    auVar48 = divps(auVar40,auVar31);
    vVar38.field_0.x = auVar48._0_4_ * 6000.0;
    vVar38.field_1.y = auVar48._4_4_ * 6000.0;
    this->m_Vel = vVar38;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacterCore::Tick(bool UseInput)
{
	m_TriggeredEvents = 0;

	// get ground state
	const bool Grounded =
		m_pCollision->CheckPoint(m_Pos.x+PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5)
		|| m_pCollision->CheckPoint(m_Pos.x-PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5);

	vec2 TargetDirection = normalize(vec2(m_Input.m_TargetX, m_Input.m_TargetY));

	m_Vel.y += m_pWorld->m_Tuning.m_Gravity;

	float MaxSpeed = Grounded ? m_pWorld->m_Tuning.m_GroundControlSpeed : m_pWorld->m_Tuning.m_AirControlSpeed;
	float Accel = Grounded ? m_pWorld->m_Tuning.m_GroundControlAccel : m_pWorld->m_Tuning.m_AirControlAccel;
	float Friction = Grounded ? m_pWorld->m_Tuning.m_GroundFriction : m_pWorld->m_Tuning.m_AirFriction;

	// handle input
	if(UseInput)
	{
		m_Direction = m_Input.m_Direction;
		m_Angle = (int)(angle(vec2(m_Input.m_TargetX, m_Input.m_TargetY))*256.0f);

		// handle jump
		if(m_Input.m_Jump)
		{
			if(!(m_Jumped&1))
			{
				if(Grounded)
				{
					m_TriggeredEvents |= COREEVENTFLAG_GROUND_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_GroundJumpImpulse;
					m_Jumped |= 1;
				}
				else if(!(m_Jumped&2))
				{
					m_TriggeredEvents |= COREEVENTFLAG_AIR_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_AirJumpImpulse;
					m_Jumped |= 3;
				}
			}
		}
		else
			m_Jumped &= ~1;

		// handle hook
		if(m_Input.m_Hook)
		{
			if(m_HookState == HOOK_IDLE)
			{
				m_HookState = HOOK_FLYING;
				m_HookPos = m_Pos+TargetDirection*PHYS_SIZE*1.5f;
				m_HookDir = TargetDirection;
				m_HookedPlayer = -1;
				m_HookTick = 0;
				//m_TriggeredEvents |= COREEVENTFLAG_HOOK_LAUNCH;
			}
		}
		else
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_IDLE;
			m_HookPos = m_Pos;
		}
	}

	// add the speed modification according to players wanted direction
	if(m_Direction < 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, -Accel);
	if(m_Direction > 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, Accel);
	if(m_Direction == 0)
		m_Vel.x *= Friction;

	// handle jumping
	// 1 bit = to keep track if a jump has been made on this input
	// 2 bit = to keep track if a air-jump has been made
	if(Grounded)
		m_Jumped &= ~2;

	// do hook
	if(m_HookState == HOOK_IDLE)
	{
		m_HookedPlayer = -1;
		m_HookState = HOOK_IDLE;
		m_HookPos = m_Pos;
	}
	else if(m_HookState >= HOOK_RETRACT_START && m_HookState < HOOK_RETRACT_END)
	{
		m_HookState++;
	}
	else if(m_HookState == HOOK_RETRACT_END)
	{
		m_HookState = HOOK_RETRACTED;
		//m_TriggeredEvents |= COREEVENTFLAG_HOOK_RETRACT;
	}
	else if(m_HookState == HOOK_FLYING)
	{
		vec2 NewPos = m_HookPos+m_HookDir*m_pWorld->m_Tuning.m_HookFireSpeed;
		if(distance(m_Pos, NewPos) > m_pWorld->m_Tuning.m_HookLength)
		{
			m_HookState = HOOK_RETRACT_START;
			NewPos = m_Pos + normalize(NewPos-m_Pos) * m_pWorld->m_Tuning.m_HookLength;
		}

		// make sure that the hook doesn't go though the ground
		bool GoingToHitGround = false;
		bool GoingToRetract = false;
		int Hit = m_pCollision->IntersectLine(m_HookPos, NewPos, &NewPos, 0);
		if(Hit)
		{
			if(Hit&CCollision::COLFLAG_NOHOOK)
				GoingToRetract = true;
			else
				GoingToHitGround = true;
		}

		// Check against other players first
		if(m_pWorld && m_pWorld->m_Tuning.m_PlayerHooking)
		{
			float Distance = 0.0f;
			for(int i = 0; i < MAX_CLIENTS; i++)
			{
				CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
				if(!pCharCore || pCharCore == this)
					continue;

				vec2 ClosestPoint = closest_point_on_line(m_HookPos, NewPos, pCharCore->m_Pos);
				if(distance(pCharCore->m_Pos, ClosestPoint) < PHYS_SIZE+2.0f)
				{
					if(m_HookedPlayer == -1 || distance(m_HookPos, pCharCore->m_Pos) < Distance)
					{
						m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_PLAYER;
						m_HookState = HOOK_GRABBED;
						m_HookedPlayer = i;
						Distance = distance(m_HookPos, pCharCore->m_Pos);
					}
				}
			}
		}

		if(m_HookState == HOOK_FLYING)
		{
			// check against ground
			if(GoingToHitGround)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_GROUND;
				m_HookState = HOOK_GRABBED;
			}
			else if(GoingToRetract)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_HIT_NOHOOK;
				m_HookState = HOOK_RETRACT_START;
			}

			m_HookPos = NewPos;
		}
	}

	if(m_HookState == HOOK_GRABBED)
	{
		if(m_HookedPlayer != -1)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[m_HookedPlayer];
			if(pCharCore)
				m_HookPos = pCharCore->m_Pos;
			else
			{
				// release hook
				m_HookedPlayer = -1;
				m_HookState = HOOK_RETRACTED;
				m_HookPos = m_Pos;
			}

			// keep players hooked for a max of 1.5sec
			//if(Server()->Tick() > hook_tick+(Server()->TickSpeed()*3)/2)
				//release_hooked();
		}

		// don't do this hook rutine when we are hook to a player
		if(m_HookedPlayer == -1 && distance(m_HookPos, m_Pos) > 46.0f)
		{
			vec2 HookVel = normalize(m_HookPos-m_Pos)*m_pWorld->m_Tuning.m_HookDragAccel;
			// the hook as more power to drag you up then down.
			// this makes it easier to get on top of an platform
			if(HookVel.y > 0)
				HookVel.y *= 0.3f;

			// the hook will boost it's power if the player wants to move
			// in that direction. otherwise it will dampen everything abit
			if((HookVel.x < 0 && m_Direction < 0) || (HookVel.x > 0 && m_Direction > 0))
				HookVel.x *= 0.95f;
			else
				HookVel.x *= 0.75f;

			vec2 NewVel = m_Vel+HookVel;

			// check if we are under the legal limit for the hook
			if(length(NewVel) < m_pWorld->m_Tuning.m_HookDragSpeed || length(NewVel) < length(m_Vel))
				m_Vel = NewVel; // no problem. apply

		}

		// release hook (max hook time is 1.25
		m_HookTick++;
		if(m_HookedPlayer != -1 && (m_HookTick > SERVER_TICK_SPEED+SERVER_TICK_SPEED/5 || !m_pWorld->m_apCharacters[m_HookedPlayer]))
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_RETRACTED;
			m_HookPos = m_Pos;
		}
	}

	if(m_pWorld)
	{
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
			if(!pCharCore)
				continue;

			//player *p = (player*)ent;
			if(pCharCore == this) // || !(p->flags&FLAG_ALIVE)
				continue; // make sure that we don't nudge our self

			// handle player <-> player collision
			float Distance = distance(m_Pos, pCharCore->m_Pos);
			vec2 Dir = normalize(m_Pos - pCharCore->m_Pos);
			if(m_pWorld->m_Tuning.m_PlayerCollision && Distance < PHYS_SIZE*1.25f && Distance > 0.0f)
			{
				float a = (PHYS_SIZE*1.45f - Distance);
				float Velocity = 0.5f;

				// make sure that we don't add excess force by checking the
				// direction against the current velocity. if not zero.
				if(length(m_Vel) > 0.0001)
					Velocity = 1-(dot(normalize(m_Vel), Dir)+1)/2;

				m_Vel += Dir*a*(Velocity*0.75f);
				m_Vel *= 0.85f;
			}

			// handle hook influence
			if(m_HookedPlayer == i && m_pWorld->m_Tuning.m_PlayerHooking)
			{
				if(Distance > PHYS_SIZE*1.50f) // TODO: fix tweakable variable
				{
					float Accel = m_pWorld->m_Tuning.m_HookDragAccel * (Distance/m_pWorld->m_Tuning.m_HookLength);

					// add force to the hooked player
					pCharCore->m_HookDragVel += Dir*Accel*1.5f;

					// add a little bit force to the guy who has the grip
					m_HookDragVel -= Dir*Accel*0.25f;
				}
			}
		}
	}

	// clamp the velocity to something sane
	if(length(m_Vel) > 6000)
		m_Vel = normalize(m_Vel) * 6000;
}